

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modifiers.hpp
# Opt level: O2

values * __thiscall
pstore::command_line::
values<pstore::command_line::literal,pstore::command_line::literal,pstore::command_line::literal>
          (values *__return_storage_ptr__,command_line *this,literal *options,literal *options_1,
          literal *options_2)

{
  long lVar1;
  initializer_list<pstore::command_line::literal> options_00;
  literal alStack_f8 [3];
  
  literal::literal(alStack_f8,(literal *)this);
  literal::literal(alStack_f8 + 1,options);
  literal::literal(alStack_f8 + 2,options_1);
  options_00._M_len = 3;
  options_00._M_array = alStack_f8;
  details::values::values(__return_storage_ptr__,options_00);
  lVar1 = 0x90;
  do {
    literal::~literal((literal *)((long)&alStack_f8[0].name._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x48);
  return __return_storage_ptr__;
}

Assistant:

details::values values (OptsTy &&... options) {
            return details::values{std::forward<OptsTy> (options)...};
        }